

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

Frag __thiscall
re2::Regexp::Walker<re2::Frag>::WalkInternal
          (Walker<re2::Frag> *this,Regexp *re,Frag top_arg,bool use_copy)

{
  undefined1 auVar1 [16];
  Frag FVar2;
  int iVar3;
  ostream *poVar4;
  Frag FVar5;
  ulong uVar6;
  ulong uVar7;
  Regexp **ppRVar8;
  size_type sVar9;
  byte in_CL;
  Frag FVar10;
  Frag in_RDX;
  long in_RSI;
  long *in_RDI;
  Regexp **sub;
  bool stop;
  Regexp *re_1;
  WalkState<re2::Frag> *s;
  Frag t;
  value_type *in_stack_fffffffffffffd18;
  Regexp *in_stack_fffffffffffffd20;
  WalkState<re2::Frag> *in_stack_fffffffffffffd28;
  Frag in_stack_fffffffffffffd30;
  Frag local_2c0;
  undefined8 in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  LogMessage *this_00;
  byte local_211;
  Frag local_210;
  Frag local_208;
  Regexp *local_200;
  reference local_1f8;
  Walker<re2::Frag> *in_stack_fffffffffffffec0;
  Frag local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  Reset(in_stack_fffffffffffffec0);
  if (in_RSI == 0) {
    this_00 = (LogMessage *)&stack0xfffffffffffffe58;
    LogMessage::LogMessage(this_00,in_stack_fffffffffffffd58,iVar3);
    poVar4 = LogMessage::stream(this_00);
    std::operator<<(poVar4,"Walk NULL");
    LogMessage::~LogMessage((LogMessage *)in_stack_fffffffffffffd30);
    return in_RDX;
  }
  WalkState<re2::Frag>::WalkState
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd30);
  std::
  stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
  ::push((stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
          *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  local_2c0 = in_stack_fffffffffffffd30;
  do {
    while( true ) {
      Frag::Frag(&local_8);
      local_1f8 = std::
                  stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
                  ::top((stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
                         *)0x23c8e4);
      local_200 = local_1f8->re;
      if (local_1f8->n != -1) break;
      iVar3 = *(int *)((long)in_RDI + 0x14) + -1;
      *(int *)((long)in_RDI + 0x14) = iVar3;
      if (iVar3 < 0) {
        *(undefined1 *)(in_RDI + 2) = 1;
        local_210 = local_1f8->parent_arg;
        local_208 = (Frag)(**(code **)(*in_RDI + 0x28))(in_RDI,local_200,local_210);
        local_8 = local_208;
      }
      else {
        local_211 = 0;
        FVar5 = (Frag)(**(code **)(*in_RDI + 0x10))
                                (in_RDI,local_200,local_1f8->parent_arg,&local_211);
        local_1f8->pre_arg = FVar5;
        if ((local_211 & 1) == 0) {
          local_1f8->n = 0;
          local_1f8->child_args = (Frag *)0x0;
          if (local_200->nsub_ == 1) {
            local_1f8->child_args = &local_1f8->child_arg;
          }
          else if (1 < local_200->nsub_) {
            uVar6 = CONCAT62(0,local_200->nsub_);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = uVar6;
            uVar7 = SUB168(auVar1 * ZEXT816(8),0);
            if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
              uVar7 = 0xffffffffffffffff;
            }
            FVar5 = (Frag)operator_new__(uVar7);
            if (uVar6 != 0) {
              FVar10 = (Frag)((long)FVar5 + uVar6 * 8);
              FVar2 = FVar5;
              do {
                local_2c0 = FVar2;
                Frag::Frag((Frag *)local_2c0);
                FVar2 = (Frag)((long)local_2c0 + 8);
              } while ((Frag)((long)local_2c0 + 8) != FVar10);
            }
            local_1f8->child_args = (Frag *)FVar5;
          }
          break;
        }
        local_8 = local_1f8->pre_arg;
      }
LAB_0023cd34:
      std::
      stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
      ::pop((stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
             *)0x23cd42);
      sVar9 = std::
              stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
              ::size((stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
                      *)0x23cd50);
      if (sVar9 == 0) {
        return local_8;
      }
      local_1f8 = std::
                  stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
                  ::top((stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
                         *)0x23cd66);
      if (local_1f8->child_args == (Frag *)0x0) {
        local_1f8->child_arg = local_8;
      }
      else {
        local_1f8->child_args[local_1f8->n] = local_8;
      }
      local_1f8->n = local_1f8->n + 1;
    }
    if ((local_200->nsub_ == 0) ||
       (ppRVar8 = Regexp::sub(local_200), (int)(uint)local_200->nsub_ <= local_1f8->n)) {
      local_8 = (Frag)(**(code **)(*in_RDI + 0x18))
                                (in_RDI,local_200,local_1f8->parent_arg,local_1f8->pre_arg,
                                 local_1f8->child_args,local_1f8->n);
      if ((1 < local_200->nsub_) &&
         (in_stack_fffffffffffffd20 = (Regexp *)local_1f8->child_args,
         in_stack_fffffffffffffd20 != (Regexp *)0x0)) {
        operator_delete__(in_stack_fffffffffffffd20);
      }
      goto LAB_0023cd34;
    }
    if (((in_CL & 1) == 0) ||
       ((local_1f8->n < 1 || (ppRVar8[local_1f8->n + -1] != ppRVar8[local_1f8->n])))) {
      WalkState<re2::Frag>::WalkState
                ((WalkState<re2::Frag> *)in_RDI[1],in_stack_fffffffffffffd20,local_2c0);
      std::
      stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
      ::push((stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
              *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    else {
      FVar5 = (Frag)(**(code **)(*in_RDI + 0x20))(in_RDI,local_1f8->child_args[local_1f8->n + -1]);
      local_1f8->child_args[local_1f8->n] = FVar5;
      local_1f8->n = local_1f8->n + 1;
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}